

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

int __thiscall
CVmObjTads::getp_create_clone(CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  int iVar2;
  vm_obj_id_t obj;
  vm_tadsobj_hdr *pvVar3;
  CVmObject *this_00;
  vm_val_t *in_RDX;
  uint in_ESI;
  CVmObjTads *in_RDI;
  vm_tadsobj_hdr *hdr;
  ushort i;
  vm_tadsobj_prop *entry;
  CVmObjTads *tobj;
  vm_obj_id_t new_obj;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  uint *in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9a;
  unsigned_short uVar4;
  undefined2 in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffff9e;
  ushort n;
  unsigned_short local_4a;
  vm_tadsobj_prop *local_48;
  
  if ((getp_create_clone(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_create_clone(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_create_clone::desc,0);
    __cxa_guard_release(&getp_create_clone(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  pvVar3 = get_hdr(in_RDI);
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)
                     CONCAT26(in_stack_ffffffffffffff9e,
                              CONCAT24(in_stack_ffffffffffffff9c,
                                       CONCAT22(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98)
                                      )),in_stack_ffffffffffffff90,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (iVar2 == 0) {
    get_sc_count((CVmObjTads *)0x345307);
    obj = create((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                 (ushort)((ulong)in_stack_ffffffffffffff90 >> 0x10),
                 (ushort)in_stack_ffffffffffffff90);
    this_00 = vm_objp(0);
    local_4a = 0;
    while( true ) {
      n = 0;
      uVar4 = local_4a;
      uVar1 = get_sc_count((CVmObjTads *)0x345349);
      if ((int)(uint)uVar1 <= CONCAT22(n,uVar4)) break;
      uVar4 = local_4a;
      get_sc((CVmObjTads *)this_00,in_stack_ffffffffffffff8c);
      set_sc(in_RDI,n,CONCAT22(uVar4,in_stack_ffffffffffffff98));
      local_4a = local_4a + 1;
    }
    local_48 = pvVar3->prop_entry_arr;
    for (local_4a = pvVar3->prop_entry_free; local_4a != 0; local_4a = local_4a - 1) {
      (*this_00->_vptr_CVmObject[0xc])(this_00,0,(ulong)in_ESI,(ulong)local_48->prop,&local_48->val)
      ;
      local_48 = local_48 + 1;
    }
    vm_val_t::set_obj(in_RDX,obj);
  }
  return 1;
}

Assistant:

int CVmObjTads::getp_create_clone(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);
    vm_obj_id_t new_obj;
    CVmObjTads *tobj;
    vm_tadsobj_prop *entry;
    ushort i;
    vm_tadsobj_hdr *hdr = get_hdr();

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   create a new object with the same number of superclasses as I have,
     *   and with space for all of my properties 
     */
    new_obj = create(vmg_ FALSE, get_sc_count(), hdr->prop_entry_free);
    tobj = (CVmObjTads *)vm_objp(vmg_ new_obj);

    /* copy my superclass list to the new object */
    for (i = 0 ; i < get_sc_count() ; ++i)
        tobj->set_sc(vmg_ i, get_sc(i));

    /* copy my properties to the new object */
    for (i = hdr->prop_entry_free, entry = hdr->prop_entry_arr ;
         i != 0 ; --i, ++entry)
    {
        /* 
         *   Store the property in the new object.  We don't need to store
         *   undo for the property, as the object is entirely new since the
         *   last savepoint (as there can't have been a savepoint while we've
         *   been working, obviously).
         */
        tobj->set_prop(vmg_ 0, self, entry->prop, &entry->val);
    }

    /* the return value is the new object ID */
    retval->set_obj(new_obj);

    /* handled */
    return TRUE;
}